

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::SSDAtomVisitor::SSDAtomVisitor(SSDAtomVisitor *this,SimInfo *info)

{
  string local_80;
  allocator<char> local_59;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_38;
  
  ReplacementVisitor::ReplacementVisitor(&this->super_ReplacementVisitor,info);
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_002830e8;
  std::__cxx11::string::assign
            ((char *)&(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                      visitorName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSD",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSD_E",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSD_RF",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSD1",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSDQ",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SSDQO",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"TAP",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"TRED",(allocator<char> *)&local_58);
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"H",(allocator<char> *)&local_38);
  Vector<double,_3U>::Vector(&local_58);
  local_58.data_[0] = 0.0;
  local_58.data_[1] = -0.75695;
  local_58.data_[2] = 0.5206;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_80,(Vector3d *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"H",(allocator<char> *)&local_38);
  Vector<double,_3U>::Vector(&local_58);
  local_58.data_[0] = 0.0;
  local_58.data_[1] = 0.75695;
  local_58.data_[2] = 0.5206;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_80,(Vector3d *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"O",(allocator<char> *)&local_38);
  Vector<double,_3U>::Vector(&local_58);
  local_58.data_[0] = 0.0;
  local_58.data_[1] = 0.0;
  local_58.data_[2] = -0.0654;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_80,(Vector3d *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"X",&local_59);
  Vector<double,_3U>::Vector(&local_58);
  local_58.data_[0] = 0.0;
  local_58.data_[1] = 0.0;
  local_58.data_[2] = 0.0;
  Vector<double,_3U>::Vector(&local_38);
  local_38.data_[0] = 0.0;
  local_38.data_[1] = 0.0;
  local_38.data_[2] = 1.0;
  ReplacementVisitor::addSite
            (&this->super_ReplacementVisitor,&local_80,(Vector3d *)&local_58,(Vector3d *)&local_38);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

SSDAtomVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "SSDAtomVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("SSD");
      addReplacedAtomName("SSD_E");
      addReplacedAtomName("SSD_RF");
      addReplacedAtomName("SSD1");
      addReplacedAtomName("SSDQ");
      addReplacedAtomName("SSDQO");
      addReplacedAtomName("TAP");
      addReplacedAtomName("TRED");

      // this is the reference structure we'll use for the replacement:
      addSite("H", Vector3d(0.0, -0.75695, 0.5206));
      addSite("H", Vector3d(0.0, 0.75695, 0.5206));
      addSite("O", Vector3d(0.0, 0.0, -0.0654));
      addSite("X", Vector3d(0.0, 0.0, 0.0), Vector3d(0, 0, 1));
    }